

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulate.h
# Opt level: O3

uint16_t __thiscall snestistics::EmulateRegisters::read_word_PC(EmulateRegisters *this)

{
  uint16_t uVar1;
  uint uVar2;
  byte bVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar5 = this->_PC;
  bVar3 = (byte)(uVar5 >> 0x10);
  uVar2 = (uint)((ulong)uVar5 & 0xffff);
  if (((uVar2 < 0x8000) && ((uVar5 >> 0x16 & 1) == 0)) && (bVar3 = 0x7e, 0x1fff < uVar2)) {
    bVar3 = 0;
  }
  uVar4 = (ulong)bVar3 << 0x10 | (ulong)uVar5 & 0xffff;
  uVar1 = *(uint16_t *)(this->_memory + uVar4);
  if (this->_read_function != (memoryAccessFunc)0x0) {
    (*this->_read_function)
              (this->_callback_context,uVar5,(Pointer)uVar4,(uint32_t)uVar1,2,
               PROGRAM_COUNTER_RELATIVE);
    uVar5 = this->_PC;
  }
  this->_PC = uVar5 + 2;
  return uVar1;
}

Assistant:

uint16_t read_word_PC() {
		uint16_t v = read_word(_PC, MemoryAccessType::PROGRAM_COUNTER_RELATIVE);
		_PC += 2;
		return v;
	}